

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.h
# Opt level: O0

int __thiscall BitStreamReader::showBits(BitStreamReader *this,uint num)

{
  uint uVar1;
  char cVar2;
  BitStreamException *this_00;
  uint local_20;
  byte local_1c;
  uint curVal;
  uint bitLeft;
  uint prevVal;
  uint num_local;
  BitStreamReader *this_local;
  
  if ((num < 0x20) && (num <= (this->super_BitStream).m_totalBits)) {
    curVal = 0;
    uVar1 = this->m_bitLeft;
    local_20 = this->m_curVal;
    cVar2 = (char)num;
    if (uVar1 < num) {
      curVal = (local_20 & BitStream::m_masks[uVar1]) << (cVar2 - (char)uVar1 & 0x1fU);
      local_20 = getCurVal(this,(this->super_BitStream).m_buffer + 1);
      cVar2 = ' ' - cVar2;
    }
    else {
      cVar2 = -cVar2;
    }
    local_1c = (char)uVar1 + cVar2;
    return curVal + (local_20 >> (local_1c & 0x1f)) & BitStream::m_masks[num];
  }
  this_00 = (BitStreamException *)__cxa_allocate_exception(8);
  memset(this_00,0,8);
  BitStreamException::BitStreamException(this_00);
  __cxa_throw(this_00,&BitStreamException::typeinfo,BitStreamException::~BitStreamException);
}

Assistant:

[[nodiscard]] int showBits(const unsigned num) const
    {
        if (num > INT_BIT - 1 || m_totalBits < num)
            THROW_BITSTREAM_ERR;
        unsigned prevVal = 0;
        unsigned bitLeft = m_bitLeft;
        unsigned curVal = m_curVal;
        if (num <= bitLeft)
            bitLeft -= num;
        else
        {
            prevVal = (curVal & m_masks[bitLeft]) << (num - bitLeft);
            curVal = getCurVal(m_buffer + 1);
            bitLeft += INT_BIT - num;
        }
        return static_cast<int>(prevVal + (curVal >> bitLeft) & m_masks[num]);
    }